

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale.h
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
to<wchar_t>(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
            *__return_storage_ptr__,string *utf8)

{
  byte bVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar3 = 0;
  while( true ) {
    if (utf8->_M_string_length <= uVar3) {
      return __return_storage_ptr__;
    }
    bVar1 = (utf8->_M_dataplus)._M_p[uVar3];
    if (0xca < (byte)(bVar1 + 0xb)) break;
    std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  uVar4 = 0;
  if ((0xbf < bVar1) && (uVar4 = 1, 0xdf < bVar1)) {
    uVar4 = (ulong)(3 - (bVar1 < 0xf0));
  }
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           (*(code *)((long)&DAT_0011e040 + (long)(int)(&DAT_0011e040)[uVar4]))
                     (~(-1 << (6U - (char)uVar4 & 0x1f)) & (uint)bVar1,bVar1,uVar3,
                      (code *)((long)&DAT_0011e040 + (long)(int)(&DAT_0011e040)[uVar4]));
  return pbVar2;
}

Assistant:

std::basic_string<Char> to(std::string const &utf8)
{
    std::basic_string<Char> out;
    unsigned i=0;
    while(i<utf8.size()) {
        unsigned point;
        unsigned prev=i;
        point = utf8_next(utf8,i);
        if(sizeof(Char)==1 && point > 255) {
            std::ostringstream ss;
            ss << "Can't convert codepoint U" << std::hex << point <<"(" <<std::string(utf8.begin()+prev,utf8.begin()+i)<<") to Latin1";
            throw booster::runtime_error(ss.str());
        }
        else if(sizeof(Char)==2 && point >0xFFFF) { // Deal with surragates
            point-=0x10000;
            out+=static_cast<Char>(0xD800 | (point>>10));
            out+=static_cast<Char>(0xDC00 | (point & 0x3FF));
            continue;
        }
        out+=static_cast<Char>(point);
    }
    return out;
}